

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

stbi_uc * stbi__process_gif_raster(stbi__context *s,stbi__gif *g)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  stbi__gif_lzw *psVar6;
  uint uVar7;
  stbi_uc local_5d;
  stbi__int32 code;
  stbi__gif_lzw *p;
  int local_48;
  stbi__int32 clear;
  stbi__int32 valid_bits;
  stbi__int32 bits;
  stbi__int32 oldcode;
  stbi__int32 avail;
  stbi__int32 codemask;
  stbi__int32 codesize;
  stbi__uint32 first;
  stbi__int32 init_code;
  stbi__int32 len;
  stbi_uc lzw_cs;
  stbi__gif *g_local;
  stbi__context *s_local;
  
  bVar2 = stbi__get8(s);
  if (0xc < bVar2) {
    return (stbi_uc *)0x0;
  }
  uVar4 = 1 << (bVar2 & 0x1f);
  bVar1 = true;
  avail = bVar2 + 1;
  oldcode = (1 << ((byte)avail & 0x1f)) + -1;
  clear = 0;
  local_48 = 0;
  for (codesize = 0; codesize < (int)uVar4; codesize = codesize + 1) {
    g->codes[codesize].prefix = -1;
    g->codes[codesize].first = (stbi_uc)codesize;
    g->codes[codesize].suffix = (stbi_uc)codesize;
  }
  bits = uVar4 + 2;
  valid_bits = -1;
  first = 0;
  while( true ) {
    while( true ) {
      for (; local_48 < avail; local_48 = local_48 + 8) {
        if (first == 0) {
          bVar3 = stbi__get8(s);
          first = (stbi__uint32)bVar3;
          if (first == 0) {
            return g->out;
          }
        }
        first = first - 1;
        bVar3 = stbi__get8(s);
        clear = (uint)bVar3 << ((byte)local_48 & 0x1f) | clear;
      }
      uVar5 = clear & oldcode;
      clear = clear >> ((byte)avail & 0x1f);
      local_48 = local_48 - avail;
      if (uVar5 != uVar4) break;
      avail = bVar2 + 1;
      oldcode = (1 << ((byte)avail & 0x1f)) + -1;
      bits = uVar4 + 2;
      valid_bits = -1;
      bVar1 = false;
    }
    if (uVar5 == uVar4 + 1) {
      stbi__skip(s,first);
      while( true ) {
        bVar2 = stbi__get8(s);
        if (bVar2 == 0) break;
        stbi__skip(s,(uint)bVar2);
      }
      return g->out;
    }
    if (bits < (int)uVar5) break;
    if (bVar1) {
      stbi__err("no clear code");
      return (stbi_uc *)0x0;
    }
    if (valid_bits < 0) {
      if (uVar5 == bits) {
        stbi__err("illegal code in raster");
        return (stbi_uc *)0x0;
      }
    }
    else {
      uVar7 = bits + 1;
      psVar6 = g->codes + bits;
      if (0x1000 < (int)uVar7) {
        stbi__err("too many codes");
        return (stbi_uc *)0x0;
      }
      psVar6->prefix = (stbi__int16)valid_bits;
      psVar6->first = g->codes[valid_bits].first;
      if (uVar5 == uVar7) {
        local_5d = psVar6->first;
      }
      else {
        local_5d = g->codes[(int)uVar5].first;
      }
      psVar6->suffix = local_5d;
      bits = uVar7;
    }
    stbi__out_gif_code(g,(stbi__uint16)uVar5);
    valid_bits = uVar5;
    if (((bits & oldcode) == 0) && (bits < 0x1000)) {
      avail = avail + 1;
      oldcode = (1 << ((byte)avail & 0x1f)) + -1;
    }
  }
  stbi__err("illegal code in raster");
  return (stbi_uc *)0x0;
}

Assistant:

static stbi_uc *stbi__process_gif_raster(stbi__context *s, stbi__gif *g)
{
   stbi_uc lzw_cs;
   stbi__int32 len, init_code;
   stbi__uint32 first;
   stbi__int32 codesize, codemask, avail, oldcode, bits, valid_bits, clear;
   stbi__gif_lzw *p;

   lzw_cs = stbi__get8(s);
   if (lzw_cs > 12) return NULL;
   clear = 1 << lzw_cs;
   first = 1;
   codesize = lzw_cs + 1;
   codemask = (1 << codesize) - 1;
   bits = 0;
   valid_bits = 0;
   for (init_code = 0; init_code < clear; init_code++) {
      g->codes[init_code].prefix = -1;
      g->codes[init_code].first = (stbi_uc) init_code;
      g->codes[init_code].suffix = (stbi_uc) init_code;
   }

   // support no starting clear code
   avail = clear+2;
   oldcode = -1;

   len = 0;
   for(;;) {
      if (valid_bits < codesize) {
         if (len == 0) {
            len = stbi__get8(s); // start new block
            if (len == 0)
               return g->out;
         }
         --len;
         bits |= (stbi__int32) stbi__get8(s) << valid_bits;
         valid_bits += 8;
      } else {
         stbi__int32 code = bits & codemask;
         bits >>= codesize;
         valid_bits -= codesize;
         // @OPTIMIZE: is there some way we can accelerate the non-clear path?
         if (code == clear) {  // clear code
            codesize = lzw_cs + 1;
            codemask = (1 << codesize) - 1;
            avail = clear + 2;
            oldcode = -1;
            first = 0;
         } else if (code == clear + 1) { // end of stream code
            stbi__skip(s, len);
            while ((len = stbi__get8(s)) > 0)
               stbi__skip(s,len);
            return g->out;
         } else if (code <= avail) {
            if (first) return stbi__errpuc("no clear code", "Corrupt GIF");

            if (oldcode >= 0) {
               p = &g->codes[avail++];
               if (avail > 4096)        return stbi__errpuc("too many codes", "Corrupt GIF");
               p->prefix = (stbi__int16) oldcode;
               p->first = g->codes[oldcode].first;
               p->suffix = (code == avail) ? p->first : g->codes[code].first;
            } else if (code == avail)
               return stbi__errpuc("illegal code in raster", "Corrupt GIF");

            stbi__out_gif_code(g, (stbi__uint16) code);

            if ((avail & codemask) == 0 && avail <= 0x0FFF) {
               codesize++;
               codemask = (1 << codesize) - 1;
            }

            oldcode = code;
         } else {
            return stbi__errpuc("illegal code in raster", "Corrupt GIF");
         }
      }
   }
}